

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# localization.cpp
# Opt level: O2

bool __thiscall
CLocalizationDatabase::Load
          (CLocalizationDatabase *this,char *pFilename,IStorage *pStorage,IConsole *pConsole)

{
  char cVar1;
  long lVar2;
  char cVar3;
  int iVar4;
  undefined4 extraout_var;
  long lVar5;
  char *pcVar6;
  json_value *this_00;
  _json_value *this_01;
  _json_value *p_Var7;
  char *pcVar8;
  char *pcVar9;
  char cVar10;
  bool bVar11;
  uint i;
  uint uVar12;
  long in_FS_OFFSET;
  json_settings JsonSettings;
  char aError [256];
  char aBuf [256];
  IOHANDLE io;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  if (*pFilename == '\0') {
    array<CLocalizationDatabase::CString,_allocator_default<CLocalizationDatabase::CString>_>::clear
              ((array<CLocalizationDatabase::CString,_allocator_default<CLocalizationDatabase::CString>_>
                *)this);
    this->m_CurrentVersion = 0;
    bVar11 = true;
  }
  else {
    bVar11 = false;
    iVar4 = (*(pStorage->super_IInterface)._vptr_IInterface[4])
                      (pStorage,pFilename,1,0xffffffffffffffff,0,0,0,0);
    io = (IOHANDLE)CONCAT44(extraout_var,iVar4);
    if (io != (IOHANDLE)0x0) {
      lVar5 = io_length(io);
      uVar12 = (uint)lVar5;
      pcVar6 = (char *)mem_alloc(uVar12);
      io_read(io,pcVar6,uVar12);
      io_close(io);
      str_format(aBuf,0x100,"loaded \'%s\'",pFilename);
      (*(pConsole->super_IInterface)._vptr_IInterface[0x19])(pConsole,1,"localization",aBuf,0);
      array<CLocalizationDatabase::CString,_allocator_default<CLocalizationDatabase::CString>_>::
      clear((array<CLocalizationDatabase::CString,_allocator_default<CLocalizationDatabase::CString>_>
             *)this);
      mem_zero(&JsonSettings,0x30);
      this_00 = json_parse_ex(&JsonSettings,pcVar6,(long)(int)uVar12,aError);
      mem_free(pcVar6);
      bVar11 = this_00 != (json_value *)0x0;
      if (this_00 == (json_value *)0x0) {
        (*(pConsole->super_IInterface)._vptr_IInterface[0x19])(pConsole,1,pFilename,aError,0);
      }
      else {
        this_01 = _json_value::operator[](this_00,"translated strings");
        if (this_01->type == json_array) {
          for (uVar12 = 0; uVar12 < (this_01->u).string.length; uVar12 = uVar12 + 1) {
            p_Var7 = _json_value::operator[](this_01,uVar12);
            p_Var7 = _json_value::operator[](p_Var7,"or");
            pcVar6 = "";
            if (p_Var7->type == json_string) {
              pcVar6 = (p_Var7->u).string.ptr;
            }
            p_Var7 = _json_value::operator[](this_01,uVar12);
            p_Var7 = _json_value::operator[](p_Var7,"tr");
            pcVar8 = "";
            if (p_Var7->type == json_string) {
              pcVar8 = (p_Var7->u).string.ptr;
            }
            for (; (cVar3 = *pcVar6, cVar3 != '\0' && (cVar10 = *pcVar8, cVar10 != '\0'));
                pcVar8 = pcVar8 + (cVar3 != '\0')) {
              while ((cVar3 != '%' && (cVar3 != '\0'))) {
                pcVar9 = pcVar6 + 1;
                pcVar6 = pcVar6 + 1;
                cVar3 = *pcVar9;
              }
              while ((cVar10 != '\0' && (cVar10 != '%'))) {
                pcVar9 = pcVar8 + 1;
                pcVar8 = pcVar8 + 1;
                cVar10 = *pcVar9;
              }
              if (cVar3 != '\0') {
                if (cVar10 != '\0') {
                  cVar10 = pcVar6[1];
                  cVar1 = pcVar8[1];
                  if (cVar10 == '\0') {
                    if (cVar1 == ' ') break;
                  }
                  else if ((cVar10 == ' ') && (cVar1 == '\0')) break;
                  if (cVar10 == cVar1) goto LAB_0017b270;
                }
LAB_0017b301:
                p_Var7 = _json_value::operator[](this_01,uVar12);
                p_Var7 = _json_value::operator[](p_Var7,"or");
                pcVar6 = "";
                if (p_Var7->type == json_string) {
                  pcVar6 = (p_Var7->u).string.ptr;
                }
                p_Var7 = _json_value::operator[](this_01,uVar12);
                p_Var7 = _json_value::operator[](p_Var7,"tr");
                pcVar8 = "";
                if (p_Var7->type == json_string) {
                  pcVar8 = (p_Var7->u).string.ptr;
                }
                str_format(aBuf,0x100,"skipping invalid entry or:\'%s\', tr:\'%s\'",pcVar6,pcVar8);
                (*(pConsole->super_IInterface)._vptr_IInterface[0x19])
                          (pConsole,1,"localization",aBuf,0);
                goto LAB_0017b386;
              }
              if (cVar10 != '\0') goto LAB_0017b301;
LAB_0017b270:
              pcVar6 = pcVar6 + (cVar3 != '\0');
            }
            p_Var7 = _json_value::operator[](this_01,uVar12);
            p_Var7 = _json_value::operator[](p_Var7,"or");
            pcVar6 = "";
            if (p_Var7->type == json_string) {
              pcVar6 = (p_Var7->u).string.ptr;
            }
            p_Var7 = _json_value::operator[](this_01,uVar12);
            p_Var7 = _json_value::operator[](p_Var7,"tr");
            pcVar8 = "";
            if (p_Var7->type == json_string) {
              pcVar8 = (p_Var7->u).string.ptr;
            }
            p_Var7 = _json_value::operator[](this_01,uVar12);
            p_Var7 = _json_value::operator[](p_Var7,"context");
            pcVar9 = "";
            if (p_Var7->type == json_string) {
              pcVar9 = (p_Var7->u).string.ptr;
            }
            AddString(this,pcVar6,pcVar8,pcVar9);
LAB_0017b386:
          }
        }
        json_value_free(this_00);
        iVar4 = this->m_VersionCounter + 1;
        this->m_VersionCounter = iVar4;
        this->m_CurrentVersion = iVar4;
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
    __stack_chk_fail();
  }
  return bVar11;
}

Assistant:

bool CLocalizationDatabase::Load(const char *pFilename, IStorage *pStorage, IConsole *pConsole)
{
	// empty string means unload
	if(pFilename[0] == 0)
	{
		m_Strings.clear();
		m_CurrentVersion = 0;
		return true;
	}

	// read file data into buffer
	IOHANDLE File = pStorage->OpenFile(pFilename, IOFLAG_READ, IStorage::TYPE_ALL);
	if(!File)
		return false;
	int FileSize = (int)io_length(File);
	char *pFileData = (char *)mem_alloc(FileSize);
	io_read(File, pFileData, FileSize);
	io_close(File);

	// init
	char aBuf[256];
	str_format(aBuf, sizeof(aBuf), "loaded '%s'", pFilename);
	pConsole->Print(IConsole::OUTPUT_LEVEL_ADDINFO, "localization", aBuf);
	m_Strings.clear();

	// parse json data
	json_settings JsonSettings;
	mem_zero(&JsonSettings, sizeof(JsonSettings));
	char aError[256];
	json_value *pJsonData = json_parse_ex(&JsonSettings, pFileData, FileSize, aError);
	mem_free(pFileData);
	
	if(pJsonData == 0)
	{
		pConsole->Print(IConsole::OUTPUT_LEVEL_ADDINFO, pFilename, aError);
		return false;
	}

	// extract data
	const json_value &rStart = (*pJsonData)["translated strings"];
	if(rStart.type == json_array)
	{
		for(unsigned i = 0; i < rStart.u.array.length; ++i)
		{
			bool Valid = true;
			const char *pOr = (const char *)rStart[i]["or"];
			const char *pTr = (const char *)rStart[i]["tr"];
			while(pOr[0] && pTr[0])
			{
				for(; pOr[0] && pOr[0] != '%'; ++pOr);
				for(; pTr[0] && pTr[0] != '%'; ++pTr);
				if(pOr[0] && pTr[0] && ((pOr[1] == ' ' && pTr[1] == 0) || (pOr[1] == 0 && pTr[1] == ' ')))	// skip  false positive
					break;
				if((pOr[0] && (!pTr[0] || pOr[1] != pTr[1])) || (pTr[0] && (!pOr[0] || pTr[1] != pOr[1])))
				{
					Valid = false;
					str_format(aBuf, sizeof(aBuf), "skipping invalid entry or:'%s', tr:'%s'", (const char *)rStart[i]["or"], (const char *)rStart[i]["tr"]);
					pConsole->Print(IConsole::OUTPUT_LEVEL_ADDINFO, "localization", aBuf);
					break;
				}
				if(pOr[0])
					++pOr;
				if(pTr[0])
					++pTr;
			}
			if(Valid)
				AddString((const char *)rStart[i]["or"], (const char *)rStart[i]["tr"], (const char *)rStart[i]["context"]);
		}
	}

	// clean up
	json_value_free(pJsonData);
	m_CurrentVersion = ++m_VersionCounter;
	return true;
}